

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O3

void icu_63::anon_unknown_16::appendSubtag
               (CharString *s,char letter,char *subtag,int32_t length,UErrorCode *errorCode)

{
  char c;
  ulong uVar1;
  
  if ((length != 0) && (*errorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (s->len != 0) {
      CharString::append(s,'_',errorCode);
    }
    CharString::append(s,letter,errorCode);
    if (0 < length) {
      uVar1 = 0;
      do {
        c = uprv_toupper_63(subtag[uVar1]);
        CharString::append(s,c,errorCode);
        uVar1 = uVar1 + 1;
      } while ((uint)length != uVar1);
    }
  }
  return;
}

Assistant:

void appendSubtag(CharString &s, char letter, const char *subtag, int32_t length,
                  UErrorCode &errorCode) {
    if(U_FAILURE(errorCode) || length == 0) { return; }
    if(!s.isEmpty()) {
        s.append('_', errorCode);
    }
    s.append(letter, errorCode);
    for(int32_t i = 0; i < length; ++i) {
        s.append(uprv_toupper(subtag[i]), errorCode);
    }
}